

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::DirectiveSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((((((kind == BeginKeywordsDirective) || (kind == CellDefineDirective)) ||
         (kind == DefaultDecayTimeDirective)) ||
        (((kind == DefaultNetTypeDirective || (kind == DefaultTriregStrengthDirective)) ||
         ((kind == DefineDirective ||
          ((kind - DelayModeDistributedDirective < 4 || (kind == ElsIfDirective)))))))) ||
       ((kind == ElseDirective ||
        (((kind - EndCellDefineDirective < 5 || (kind == IfDefDirective)) ||
         (kind == IfNDefDirective)))))) ||
      (((kind == IncludeDirective || (kind == LineDirective)) ||
       (((kind == MacroUsage || ((kind == NoUnconnectedDriveDirective || (kind == PragmaDirective)))
         ) || (kind - ProtectDirective < 2)))))) ||
     (((kind == ResetAllDirective || (kind == TimeScaleDirective)) ||
      (kind - UnconnectedDriveDirective < 3)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DirectiveSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BeginKeywordsDirective:
        case SyntaxKind::CellDefineDirective:
        case SyntaxKind::DefaultDecayTimeDirective:
        case SyntaxKind::DefaultNetTypeDirective:
        case SyntaxKind::DefaultTriregStrengthDirective:
        case SyntaxKind::DefineDirective:
        case SyntaxKind::DelayModeDistributedDirective:
        case SyntaxKind::DelayModePathDirective:
        case SyntaxKind::DelayModeUnitDirective:
        case SyntaxKind::DelayModeZeroDirective:
        case SyntaxKind::ElsIfDirective:
        case SyntaxKind::ElseDirective:
        case SyntaxKind::EndCellDefineDirective:
        case SyntaxKind::EndIfDirective:
        case SyntaxKind::EndKeywordsDirective:
        case SyntaxKind::EndProtectDirective:
        case SyntaxKind::EndProtectedDirective:
        case SyntaxKind::IfDefDirective:
        case SyntaxKind::IfNDefDirective:
        case SyntaxKind::IncludeDirective:
        case SyntaxKind::LineDirective:
        case SyntaxKind::MacroUsage:
        case SyntaxKind::NoUnconnectedDriveDirective:
        case SyntaxKind::PragmaDirective:
        case SyntaxKind::ProtectDirective:
        case SyntaxKind::ProtectedDirective:
        case SyntaxKind::ResetAllDirective:
        case SyntaxKind::TimeScaleDirective:
        case SyntaxKind::UnconnectedDriveDirective:
        case SyntaxKind::UndefDirective:
        case SyntaxKind::UndefineAllDirective:
            return true;
        default:
            return false;
    }
}